

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

uint_t flexfloat_pack_bits(flexfloat_desc_t desc,uint_t bits)

{
  ulong exp_00;
  ulong frac_00;
  ulong in_RSI;
  undefined2 in_DI;
  bool bVar1;
  uint_t frac;
  int_fast16_t exp;
  _Bool sign;
  _Bool in_stack_ffffffffffffffe5;
  uint8_t in_stack_ffffffffffffffe6;
  flexfloat_desc_t desc_00;
  undefined1 local_a;
  undefined1 uStack_9;
  undefined8 local_8;
  
  local_a = (byte)in_DI;
  uStack_9 = (byte)((ushort)in_DI >> 8);
  bVar1 = (in_RSI >> (local_a + uStack_9 & 0x3f) & 1) != 0;
  desc_00.frac_bits = bVar1;
  desc_00.exp_bits = in_stack_ffffffffffffffe6;
  exp_00 = in_RSI >> (uStack_9 & 0x3f) & (long)((1 << (local_a & 0x1f)) + -1);
  frac_00 = in_RSI & (1L << (uStack_9 & 0x3f)) - 1U;
  if ((exp_00 == 0) && (frac_00 == 0)) {
    local_8 = (ulong)bVar1 << 0x3f;
  }
  else if ((long)exp_00 < 1) {
    while( true ) {
      bVar1 = false;
      if (frac_00 != 0) {
        frac_00 = frac_00 << 1;
        bVar1 = (frac_00 & 1L << (uStack_9 & 0x3f)) == 0;
      }
      if (!bVar1) break;
      exp_00 = exp_00 - 1;
    }
    local_8 = flexfloat_pack(desc_00,in_stack_ffffffffffffffe5,exp_00,
                             (1L << (uStack_9 & 0x3f)) - 1U & frac_00);
  }
  else {
    local_8 = flexfloat_pack(desc_00,in_stack_ffffffffffffffe5,exp_00,frac_00);
  }
  return local_8;
}

Assistant:

uint_t flexfloat_pack_bits(flexfloat_desc_t desc, uint_t bits)
{
    bool sign = (bits >> (desc.exp_bits + desc.frac_bits)) & 0x1;
    int_fast16_t exp = (bits >> desc.frac_bits) & ((0x1<<desc.exp_bits) - 1);
    uint_t frac = bits & ((UINT_C(1)<<desc.frac_bits) - 1);

    if(exp == 0 && frac == 0)
    {
        return PACK(sign, 0, 0);
    }
    else if(exp <= 0) // denormal
    {
        // printf("[ff_pack_bits] normalizing 0x%016lx, exp %d\n", frac, exp);
        while (frac && !((frac <<= 1) & (UINT_C(1) << desc.frac_bits))) // normalize
            exp--;
        frac &= ((UINT_C(1) << desc.frac_bits) - 1); // remove implicit bit
        // printf("[ff_pack_bits] done normalizing 0x%016lx, exp %d\n", frac, exp);
        return flexfloat_pack(desc, sign, exp, frac);
    }
    else
    {
        return flexfloat_pack(desc, sign, exp, frac);
    }
}